

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.cpp
# Opt level: O3

vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_> *
__thiscall
program_options::command_line_parser::run_impl
          (vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
           *__return_storage_ptr__,command_line_parser *this)

{
  pointer pbVar1;
  pointer pbVar2;
  pointer pbVar3;
  pointer pbVar4;
  long lVar5;
  byte bVar6;
  style_t sVar7;
  uint uVar8;
  uint uVar9;
  value_type *__x;
  pointer pbVar10;
  option_description *this_00;
  pointer pbVar11;
  undefined8 uVar12;
  too_many_positional_options_error *this_01;
  pointer pbVar13;
  ulong uVar14;
  pointer pbVar15;
  size_type *psVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  pointer pbVar20;
  byte bVar21;
  uint uVar22;
  undefined8 uVar23;
  bool bVar24;
  vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
  *result;
  vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
  next;
  vector<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
  style_parsers;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  e;
  _Any_data local_d8;
  undefined1 local_c8 [32];
  undefined8 uStack_a8;
  pointer local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_98;
  undefined2 local_80;
  vector<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  local_78.
  super__Vector_base<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar7 = this->m_style;
  if ((sVar7 & allow_long) != 0) {
    local_d8._8_8_ = 0;
    local_c8._8_8_ =
         std::
         _Function_handler<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/replacements/program_options/command_line.cpp:86:21)>
         ::_M_invoke;
    local_c8._0_8_ =
         std::
         _Function_handler<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/replacements/program_options/command_line.cpp:86:21)>
         ::_M_manager;
    local_d8._M_unused._M_object = this;
    std::
    vector<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>,std::allocator<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>>>
    ::
    emplace_back<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>>
              ((vector<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>,std::allocator<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>>>
                *)&local_78,
               (function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
                *)&local_d8);
    if ((code *)local_c8._0_8_ != (code *)0x0) {
      (*(code *)local_c8._0_8_)(&local_d8,&local_d8,3);
    }
    sVar7 = this->m_style;
  }
  if ((sVar7 >> 0xc & 1) != 0) {
    local_d8._8_8_ = 0;
    local_c8._8_8_ =
         std::
         _Function_handler<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/replacements/program_options/command_line.cpp:93:21)>
         ::_M_invoke;
    local_c8._0_8_ =
         std::
         _Function_handler<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/replacements/program_options/command_line.cpp:93:21)>
         ::_M_manager;
    local_d8._M_unused._M_object = this;
    std::
    vector<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>,std::allocator<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>>>
    ::
    emplace_back<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>>
              ((vector<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>,std::allocator<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>>>
                *)&local_78,
               (function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
                *)&local_d8);
    if ((code *)local_c8._0_8_ != (code *)0x0) {
      (*(code *)local_c8._0_8_)(&local_d8,&local_d8,3);
    }
    sVar7 = this->m_style;
  }
  if ((~sVar7 & 6) == 0) {
    local_d8._8_8_ = 0;
    local_c8._8_8_ =
         std::
         _Function_handler<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/replacements/program_options/command_line.cpp:100:21)>
         ::_M_invoke;
    local_c8._0_8_ =
         std::
         _Function_handler<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/replacements/program_options/command_line.cpp:100:21)>
         ::_M_manager;
    local_d8._M_unused._M_object = this;
    std::
    vector<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>,std::allocator<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>>>
    ::
    emplace_back<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>>
              ((vector<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>,std::allocator<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>>>
                *)&local_78,
               (function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
                *)&local_d8);
    if ((code *)local_c8._0_8_ != (code *)0x0) {
      (*(code *)local_c8._0_8_)(&local_d8,&local_d8,3);
    }
    sVar7 = this->m_style;
  }
  if ((~sVar7 & 10) == 0) {
    local_d8._8_8_ = 0;
    local_c8._8_8_ =
         std::
         _Function_handler<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/replacements/program_options/command_line.cpp:107:21)>
         ::_M_invoke;
    local_c8._0_8_ =
         std::
         _Function_handler<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/replacements/program_options/command_line.cpp:107:21)>
         ::_M_manager;
    local_d8._M_unused._M_object = this;
    std::
    vector<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>,std::allocator<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>>>
    ::
    emplace_back<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>>
              ((vector<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>,std::allocator<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>>>
                *)&local_78,
               (function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
                *)&local_d8);
    if ((code *)local_c8._0_8_ != (code *)0x0) {
      (*(code *)local_c8._0_8_)(&local_d8,&local_d8,3);
    }
  }
  local_d8._8_8_ = (pointer)0x0;
  local_c8._8_8_ =
       std::
       _Function_handler<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/replacements/program_options/command_line.cpp:113:17)>
       ::_M_invoke;
  local_c8._0_8_ =
       std::
       _Function_handler<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/replacements/program_options/command_line.cpp:113:17)>
       ::_M_manager;
  local_d8._M_unused._M_object = this;
  std::
  vector<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>,std::allocator<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>>>
  ::
  emplace_back<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>>
            ((vector<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>,std::allocator<std::function<std::vector<program_options::basic_option<char>,std::allocator<program_options::basic_option<char>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>>>
              *)&local_78,
             (function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
              *)&local_d8);
  if ((pointer)local_c8._0_8_ != (pointer)0x0) {
    (*(code *)local_c8._0_8_)(&local_d8,&local_d8,3);
  }
  (__return_storage_ptr__->
  super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __x = (this->m_rawArguments).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  if (__x == (this->m_rawArguments).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) {
    local_c8._0_8_ = (pointer)0x0;
    pbVar11 = (pointer)0x0;
    pbVar15 = (pointer)0x0;
    uVar12 = (pointer)0x0;
    uVar23 = (pointer)0x0;
  }
  else {
    do {
      if (local_78.
          super__Vector_base<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_78.
          super__Vector_base<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        uVar18 = 0;
        do {
          if ((_Manager_type)
              (((pointer)
               (local_78.
                super__Vector_base<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar18))->field_2)._M_allocated_capacity
              == (_Manager_type)0x0) {
            std::__throw_bad_function_call();
            goto LAB_001109db;
          }
          pbVar1 = (this->m_rawArguments).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pbVar2 = (this->m_rawArguments).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          (**(code **)(((_Any_data *)
                       (local_78.
                        super__Vector_base<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar18))->_M_pod_data + 0x18))
                    ((vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                      *)&local_d8,
                     (_Any_data *)
                     (local_78.
                      super__Vector_base<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar18),&this->m_rawArguments);
          if (local_d8._M_unused._M_object != (void *)local_d8._8_8_) {
            local_58.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_58.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_58.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            if (local_d8._8_8_ - local_d8._0_8_ != 0x60) {
              uVar14 = 0;
              uVar19 = 1;
              do {
                finish_option(this,(option *)(uVar14 * 0x60 + (long)local_d8._M_unused._0_8_),
                              &local_58,&local_78);
                bVar24 = uVar19 < ((long)(local_d8._8_8_ - local_d8._0_8_) >> 5) *
                                  -0x5555555555555555 - 1U;
                uVar14 = uVar19;
                uVar19 = (ulong)((int)uVar19 + 1);
              } while (bVar24);
            }
            finish_option(this,(option *)(local_d8._8_8_ + -0x60),&this->m_rawArguments,&local_78);
            if ((void *)local_d8._8_8_ != local_d8._M_unused._M_object) {
              uVar14 = 0;
              uVar19 = 1;
              do {
                std::
                vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                ::push_back(__return_storage_ptr__,
                            (value_type *)(uVar14 * 0x60 + (long)local_d8._M_unused._0_8_));
                uVar14 = ((long)(local_d8._8_8_ - local_d8._0_8_) >> 5) * -0x5555555555555555;
                bVar24 = uVar19 <= uVar14;
                lVar5 = uVar14 - uVar19;
                uVar14 = uVar19;
                uVar19 = (ulong)((int)uVar19 + 1);
              } while (bVar24 && lVar5 != 0);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_58);
          }
          pbVar3 = (this->m_rawArguments).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pbVar4 = (this->m_rawArguments).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          std::
          vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
          ::~vector((vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                     *)&local_d8);
          if ((long)pbVar3 - (long)pbVar4 >> 5 !=
              ((ulong)((long)pbVar1 - (long)pbVar2) >> 5 & 0xffffffff)) goto LAB_00110678;
          uVar18 = (ulong)((int)uVar18 + 1);
        } while (uVar18 < (ulong)((long)local_78.
                                        super__Vector_base<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_78.
                                        super__Vector_base<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 5));
        __x = (this->m_rawArguments).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
      }
      local_d8._M_unused._M_object = local_c8;
      local_d8._8_8_ = (pointer)0x0;
      local_c8._0_8_ = local_c8._0_8_ & 0xffffffffffffff00;
      local_c8._16_4_ = 0xffffffff;
      vStack_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_a0 = (pointer)0x0;
      vStack_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_c8._24_8_ = 0;
      uStack_a8._0_4_ = 0;
      uStack_a8._4_4_ = 0;
      local_80 = 0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_c8 + 0x18),__x);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&vStack_98,
                  (this->m_rawArguments).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start);
      std::
      vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)&local_d8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase(&this->m_rawArguments,
                 (this->m_rawArguments).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&vStack_98);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_c8 + 0x18));
      if ((pointer)local_d8._M_unused._0_8_ != (pointer)local_c8) {
        operator_delete(local_d8._M_unused._M_object,(ulong)(local_c8._0_8_ + 1));
      }
LAB_00110678:
      __x = (this->m_rawArguments).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
    } while (__x != (this->m_rawArguments).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
    pbVar15 = (__return_storage_ptr__->
              super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pbVar11 = (__return_storage_ptr__->
              super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    local_d8._M_unused._M_object = (pointer)0x0;
    local_d8._8_8_ = (pointer)0x0;
    local_c8._0_8_ = (pointer)0x0;
    pbVar20 = (pointer)0x0;
    pbVar10 = (pointer)0x0;
    if (pbVar11 == pbVar15) {
      uVar12 = pbVar10;
      local_c8._0_8_ = pbVar20;
      uVar23 = (pointer)0x0;
    }
    else {
      do {
        uVar22 = (uint)pbVar20;
        std::
        vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
        ::push_back((vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                     *)&local_d8,pbVar15 + (long)pbVar10);
        uVar23 = local_d8._8_8_;
        if (*(size_type *)(local_d8._8_8_ - 0x58) != 0) {
          sVar7 = this->m_style;
          this_00 = options_description::find_nothrow
                              (this->m_options_description,(string *)(local_d8._8_8_ - 0x60),
                               (bool)((byte)(sVar7 >> 9) & 1),(bool)((byte)(sVar7 >> 10) & 1),
                               (bool)((byte)(sVar7 >> 0xb) & 1));
          if (this_00 != (option_description *)0x0) {
            option_description::semantic(this_00);
            uVar8 = (**(code **)(((local_58.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                                0x18))();
            if (local_58.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_58.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
            }
            option_description::semantic(this_00);
            uVar9 = (**(code **)(((local_58.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                                0x20))();
            if (local_58.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_58.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
            }
            if (((uVar8 < uVar9) &&
                (uVar18 = (long)*(pointer *)(uVar23 - 0x30) -
                          (long)(((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)(uVar23 - 0x38))->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start >> 5, uVar18 < uVar9)) &&
               (uVar8 = (uint)uVar18, uVar9 != uVar8)) {
              local_38 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)(uVar23 - 0x38);
              iVar17 = uVar8 - uVar9;
              do {
                uVar22 = (uint)pbVar20;
                pbVar20 = (pointer)(ulong)(uVar22 + 1);
                pbVar15 = (__return_storage_ptr__->
                          super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                pbVar11 = (pointer)(((long)(__return_storage_ptr__->
                                           super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pbVar15 >> 5) * -0x5555555555555555);
                if (((pbVar11 < pbVar20 || (long)pbVar11 - (long)pbVar20 == 0) ||
                    (pbVar15[(long)pbVar20].string_key._M_string_length != 0)) ||
                   (pbVar15[(long)pbVar20].position_key == 0x7fffffff)) break;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(local_38,pbVar15[(long)pbVar20].value.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)(uVar23 - 0x20),
                            pbVar15[(long)pbVar20].original_tokens.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
                iVar17 = iVar17 + 1;
                uVar22 = uVar22 + 1;
              } while (iVar17 != 0);
            }
          }
        }
        pbVar10 = (pointer)(ulong)(uVar22 + 1);
        pbVar15 = (__return_storage_ptr__->
                  super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pbVar11 = (__return_storage_ptr__->
                  super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        pbVar13 = (pointer)(((long)pbVar11 - (long)pbVar15 >> 5) * -0x5555555555555555);
        pbVar20 = (pointer)(ulong)(uVar22 + 1);
        uVar12 = local_d8._8_8_;
        uVar23 = local_d8._M_unused._0_8_;
      } while (pbVar10 <= pbVar13 && (long)pbVar13 - (long)pbVar10 != 0);
    }
  }
  uVar18 = ((long)(uVar12 - uVar23) >> 5) * -0x5555555555555555;
  pbVar10 = (__return_storage_ptr__->
            super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->
  super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)uVar23;
  (__return_storage_ptr__->
  super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)uVar12;
  (__return_storage_ptr__->
  super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_c8._0_8_;
  local_d8._M_unused._0_8_ = (undefined8)pbVar15;
  local_d8._8_8_ = pbVar11;
  local_c8._0_8_ = pbVar10;
  if (uVar12 != uVar23) {
    psVar16 = &(((pointer)uVar23)->string_key)._M_string_length;
    iVar17 = 0;
    uVar22 = 1;
    do {
      if (*psVar16 == 0) {
        *(int *)(psVar16 + 3) = iVar17;
        iVar17 = iVar17 + 1;
      }
      uVar14 = (ulong)uVar22;
      psVar16 = psVar16 + 0xc;
      uVar22 = uVar22 + 1;
    } while (uVar14 <= uVar18 && uVar18 - uVar14 != 0);
    if (this->m_positional_options_description != (positional_options_description *)0x0 &&
        uVar12 != uVar23) {
      uVar22 = 0;
      uVar14 = 0;
      uVar19 = 1;
      do {
        if (((pointer)(uVar23 + uVar14 * 0x60))->position_key != -1) {
          uVar8 = positional_options_description::max_total_count
                            (this->m_positional_options_description);
          if (uVar8 <= uVar22) {
LAB_001109db:
            this_01 = (too_many_positional_options_error *)__cxa_allocate_exception(0x10);
            too_many_positional_options_error::too_many_positional_options_error(this_01);
            __cxa_throw(this_01,&too_many_positional_options_error::typeinfo,
                        std::logic_error::~logic_error);
          }
          positional_options_description::name_for_position_abi_cxx11_
                    (this->m_positional_options_description,uVar22);
          std::__cxx11::string::_M_assign((string *)(uVar23 + uVar14 * 0x60));
          uVar22 = uVar22 + 1;
          uVar23 = (__return_storage_ptr__->
                   super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          uVar12 = (__return_storage_ptr__->
                   super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        }
        uVar18 = ((long)(uVar12 - uVar23) >> 5) * -0x5555555555555555;
        bVar24 = uVar19 <= uVar18;
        lVar5 = uVar18 - uVar19;
        uVar14 = uVar19;
        uVar19 = (ulong)((int)uVar19 + 1);
      } while (bVar24 && lVar5 != 0);
    }
  }
  if (uVar12 != uVar23) {
    sVar7 = this->m_style;
    bVar6 = (byte)(sVar7 >> 10);
    uVar22 = 1;
    do {
      uVar14 = (((pointer)uVar23)->string_key)._M_string_length;
      bVar21 = bVar6;
      if ((uVar14 < 3) &&
         ((uVar14 != 2 || (*(((pointer)uVar23)->string_key)._M_dataplus._M_p == '-')))) {
        bVar21 = (byte)(sVar7 >> 0xb);
      }
      ((pointer)uVar23)->case_insensitive = (bool)(bVar21 & 1);
      uVar14 = (ulong)uVar22;
      uVar23 = uVar23 + 0x60;
      uVar22 = uVar22 + 1;
    } while (uVar14 < uVar18);
  }
  std::
  vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
  ::~vector((vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
             *)&local_d8);
  std::
  vector<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::allocator<std::function<std::vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
  ::~vector(&local_78);
  return __return_storage_ptr__;
}

Assistant:

std::vector<option> command_line_parser::run_impl()
{
    using namespace command_line_style;
    // The parsing is done by having a set of 'style parsers'
    // and trying then in order. Each parser is passed a vector
    // of unparsed tokens and can consume some of them (by
    // removing elements on front) and return a vector of options.
    //
    // We try each style parser in turn, untill some input
    // is consumed. The returned vector of option may contain the
    // result of just syntactic parsing of token, say --foo will
    // be parsed as option with name 'foo', and the style parser
    // is not required to care if that option is defined, and how
    // many tokens the value may take.
    // So, after vector is returned, we validate them.
    assert(m_options_description);

    std::vector<style_parser> style_parsers;

    //if (m_style_parser)
    //    style_parsers.push_back(m_style_parser);

    //if (m_additional_parser) {
    //    style_parsers.push_back([this] (std::vector<std::string>& args) {
    //        return this->handle_additional_parser(args);
    //    });
    //}

    if (m_style & allow_long) {
        style_parsers.push_back(
                    [this] (std::vector<std::string>& args) {
            return this->parse_long_option(args);
        });
    }

    if ((m_style & allow_long_disguise)) {
        style_parsers.push_back(
                    [this] (std::vector<std::string>& args) {
            return this->parse_disguised_long_option(args);
        });
    }

    if ((m_style & allow_short) && (m_style & allow_dash_for_short)) {
        style_parsers.push_back(
                    [this] (std::vector<std::string>& args) {
            return this->parse_short_option(args);
        });
    }

    if ((m_style & allow_short) && (m_style & allow_slash_for_short)) {
        style_parsers.push_back(
                    [this] (std::vector<std::string>& args) {
            return this->parse_dos_option(args);
        });
    }

    style_parsers.push_back(
                [this](std::vector<std::string>& args) {
        return parse_terminator(args);
    });

    std::vector<option> result;
    std::vector<std::string>& args = m_rawArguments;

    while(!args.empty())
    {
        bool ok = false;
        for(unsigned i = 0; i < style_parsers.size(); ++i)
        {
            unsigned current_size = static_cast<unsigned>(args.size());
            std::vector<option> next = style_parsers[i](args);

            // Check that option names
            // are valid, and that all values are in place.
            if (!next.empty())
            {
                std::vector<std::string> e;
                for(unsigned k = 0; k < next.size()-1; ++k) {
                    finish_option(next[k], e, style_parsers);
                }
                // For the last option, pass the unparsed tokens
                // so that they can be added to next.back()'s values
                // if appropriate.
                finish_option(next.back(), args, style_parsers);
                for (unsigned j = 0; j < next.size(); ++j)
                    result.push_back(next[j]);
            }

            if (args.size() != current_size) {
                ok = true;
                break;
            }
        }

        if (!ok) {
            option opt;
            opt.value.push_back(args[0]);
            opt.original_tokens.push_back(args[0]);
            result.push_back(opt);
            args.erase(args.begin());
        }
    }

    /* If an key option is followed by a positional option,
       can can consume more tokens (e.g. it's multitoken option),
       give those tokens to it.  */
    std::vector<option> result2;
    for (unsigned i = 0; i < result.size(); ++i)
    {
        result2.push_back(result[i]);
        option& opt = result2.back();

        if (opt.string_key.empty())
            continue;

        const option_description* xd = nullptr;
        try
        {
            xd = m_options_description->find_nothrow(opt.string_key,
                is_style_active(allow_guessing),
                is_style_active(long_case_insensitive),
                is_style_active(short_case_insensitive));
        }
        catch(error_with_option_name& e)
        {
            // add context and rethrow
            e.add_context(opt.string_key, opt.original_tokens[0], get_canonical_option_prefix());
            throw;
        }

        if (!xd)
            continue;

        unsigned min_tokens = xd->semantic()->min_tokens();
        unsigned max_tokens = xd->semantic()->max_tokens();
        if (min_tokens < max_tokens && opt.value.size() < max_tokens)
        {
            // This option may grab some more tokens.
            // We only allow to grab tokens that are not already
            // recognized as key options.

            int can_take_more = max_tokens - static_cast<int>(opt.value.size());
            unsigned j = i+1;
            for (; can_take_more && j < result.size(); --can_take_more, ++j)
            {
                option& opt2 = result[j];
                if (!opt2.string_key.empty())
                    break;

                if (opt2.position_key == INT_MAX)
                {
                    // We use INT_MAX to mark positional options that
                    // were found after the '--' terminator and therefore
                    // should stay positional forever.
                    break;
                }

                assert(opt2.value.size() == 1);

                opt.value.push_back(opt2.value[0]);

                assert(opt2.original_tokens.size() == 1);

                opt.original_tokens.push_back(opt2.original_tokens[0]);
            }
            i = j-1;
        }
    }
    result.swap(result2);


    // Assign position keys to positional options.
    int position_key = 0;
    for(unsigned i = 0; i < result.size(); ++i) {
        if (result[i].string_key.empty())
            result[i].position_key = position_key++;
    }

    if (m_positional_options_description)
    {
        unsigned position = 0;
        for (unsigned i = 0; i < result.size(); ++i) {
            option& opt = result[i];
            if (opt.position_key != -1) {
                if (position >= m_positional_options_description->max_total_count())
                {
                    throw too_many_positional_options_error();
                }
                opt.string_key = m_positional_options_description->name_for_position(position);
                ++position;
            }
        }
    }

    // set case sensitive flag
    for (unsigned i = 0; i < result.size(); ++i) {
        if (result[i].string_key.size() > 2 ||
                (result[i].string_key.size() > 1 && result[i].string_key[0] != '-'))
        {
            // it is a long option
            result[i].case_insensitive = is_style_active(long_case_insensitive);
        }
        else
        {
            // it is a short option
            result[i].case_insensitive = is_style_active(short_case_insensitive);
        }
    }

    return result;
}